

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDataServerCommand.cpp
# Opt level: O2

void * OpenDataServerCommand::readFromServer(int *soket)

{
  string *line_from_sim;
  bool bVar1;
  int iVar2;
  int iVar3;
  DataBase *pDVar4;
  ssize_t sVar5;
  DataBase *pDVar6;
  char cVar7;
  undefined1 local_478 [8];
  char buffer [1024];
  size_type *local_58;
  string sim_line;
  
  line_from_sim = (string *)(buffer + 0x3f8);
  sim_line.field_2._8_8_ = soket;
  while( true ) {
    bVar1 = DataBase::getIsRunning(data);
    if (!bVar1) {
      return (void *)0x0;
    }
    pDVar4 = DataBase::getInstance();
    if (pDVar4 == (DataBase *)0x0) break;
    memset(local_478,0,0x400);
    sVar5 = read(*(int *)sim_line.field_2._8_8_,local_478,0x400);
    local_58 = &sim_line._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,local_478,local_478 + (int)sVar5);
    cVar7 = (char)(string *)&local_58;
    iVar2 = std::__cxx11::string::find(cVar7,10);
    iVar3 = std::__cxx11::string::rfind(cVar7,10);
    if ((((iVar2 != -1) && (iVar3 != -1)) &&
        (bVar1 = std::mutex::try_lock(&data->sim_var_map_lock), bVar1)) &&
       ((bVar1 = std::mutex::try_lock(&data->in_var_map_lock), bVar1 &&
        (pDVar6 = DataBase::getInstance(), pDVar4 = data, pDVar6 != (DataBase *)0x0)))) {
      std::__cxx11::string::string((string *)line_from_sim,(string *)&local_58);
      DataBase::setSimData(pDVar4,line_from_sim);
      std::__cxx11::string::~string((string *)line_from_sim);
    }
    std::__cxx11::string::~string((string *)&local_58);
  }
  return (void *)0x0;
}

Assistant:

void *OpenDataServerCommand::readFromServer(int *soket) {
  //reading from client
  while (data->getIsRunning() && data->getInstance() != nullptr) {
    char buffer[1024] = {0};
    int valread = read(*soket, buffer, 1024);
    string sim_line(buffer, valread);
    // making sure it has 36 values between /n
    int has_n = sim_line.find_first_of('\n');
    int has_n2 = sim_line.find_last_of('\n');
    if (has_n != -1 && has_n2 != -1) {
      if (data->sim_var_map_lock.try_lock() && data->in_var_map_lock.try_lock()
          && data->getInstance() != nullptr) {
        data->setSimData(sim_line);
      }
    }
  }
  return nullptr;
}